

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall leveldb::MemTableIterator::MemTableIterator(MemTableIterator *this,Table *table)

{
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__MemTableIterator_00113530;
  (this->iter_).list_ = table;
  (this->iter_).node_ = (Node *)0x0;
  (this->tmp_)._M_dataplus._M_p = (pointer)&(this->tmp_).field_2;
  (this->tmp_)._M_string_length = 0;
  (this->tmp_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit MemTableIterator(MemTable::Table* table) : iter_(table) {}